

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
helics::createMessageFromCommand(ActionMessage *cmd)

{
  uint16_t uVar1;
  int32_t iVar2;
  size_type sVar3;
  reference __str;
  reference this;
  pointer pMVar4;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  __single_object *msg;
  SmallBuffer *in_stack_ffffffffffffffa0;
  SmallBuffer *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  std::make_unique<helics::Message>();
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0));
  switch(sVar3) {
  case 0:
    break;
  case 1:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed248);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 2:
    __str = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed285);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,__str);
    this = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed2be);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,__str);
    break;
  case 3:
    in_stack_ffffffffffffffa0 =
         (SmallBuffer *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed2fe);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffa8 =
         (SmallBuffer *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed337);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),2);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed373);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  default:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed3b3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed3ec);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),2);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed428);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),3);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed464);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed492);
  SmallBuffer::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed4b9
                     );
  (pMVar4->time).internalTimeCode = *(baseType *)(in_RSI + 0x20);
  uVar1 = *(uint16_t *)(in_RSI + 0x1a);
  pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed4e0
                     );
  pMVar4->flags = uVar1;
  iVar2 = *(int32_t *)(in_RSI + 4);
  pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5ed502
                     );
  pMVar4->messageID = iVar2;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> createMessageFromCommand(ActionMessage&& cmd)
{
    auto msg = std::make_unique<Message>();
    switch (cmd.stringData.size()) {
        case 0:
            break;
        case 1:
            msg->dest = std::move(cmd.stringData[0]);
            break;
        case 2:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            break;
        case 3:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            break;
        default:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            msg->original_dest = std::move(cmd.stringData[3]);
            break;
    }
    msg->data = std::move(cmd.payload);
    msg->time = cmd.actionTime;
    msg->flags = cmd.flags;
    msg->messageID = cmd.messageID;
    return msg;
}